

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O1

void pzshape::TPZShapeDisc::ChebyshevWithoutScale
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  int num;
  
  num = degree + 1;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (phi,(long)num,1);
  (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (dphi,(long)n,(long)num);
  TPZShapeLinear::Chebyshev(x,num,phi,dphi);
  return;
}

Assistant:

void TPZShapeDisc::ChebyshevWithoutScale(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif

   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);

   TPZShapeLinear::Chebyshev(x, degree+1, phi, dphi);

}